

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

EnumDef * __thiscall EnumDef::toJson(EnumDef *this,ClassDef *cdef)

{
  storage_type *psVar1;
  EnumDef *pEVar2;
  Data *pDVar3;
  const_iterator cVar4;
  undefined8 uVar5;
  char cVar6;
  const_iterator cVar7;
  long in_RDX;
  long lVar8;
  uint uVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QLatin1String QVar11;
  QByteArrayView QVar12;
  QLatin1String QVar13;
  QByteArrayView QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QByteArrayView QVar18;
  QLatin1String QVar19;
  undefined1 auVar20 [16];
  QJsonArray valueArr;
  undefined1 auStack_88 [16];
  undefined1 local_78 [16];
  QString local_68;
  undefined4 local_50 [6];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->name).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)this);
  local_50[0] = 0;
  if (*(long *)(in_RDX + 0x48) == 0) {
    uVar9 = 0;
  }
  else {
    cVar7 = std::
            _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
            ::find((_Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
                    *)(*(long *)(in_RDX + 0x48) + 8),(key_type *)cdef);
    cVar4._M_node = (_Base_ptr)auStack_88;
    if (cVar7._M_node != (_Base_ptr)(*(long *)(in_RDX + 0x48) + 0x10)) {
      cVar4 = cVar7;
    }
    uVar9 = *(uint *)&cVar4._M_node[1]._M_right;
  }
  uVar9 = uVar9 | (uint)(cdef->super_BaseDef).enumList.d.size;
  QVar10.m_data = (storage_type *)(cdef->super_BaseDef).classname.d.size;
  QVar10.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar10);
  QJsonValue::QJsonValue((QJsonValue *)local_50,&local_68);
  QVar11.m_data = (char *)0x4;
  QVar11.m_size = (qsizetype)this;
  local_78 = QJsonObject::operator[](QVar11);
  QJsonValueRef::operator=((QJsonValueRef *)local_78,(QJsonValue *)local_50);
  QJsonValue::~QJsonValue((QJsonValue *)local_50);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  psVar1 = (storage_type *)(cdef->super_BaseDef).qualified.d.size;
  if (psVar1 != (storage_type *)0x0) {
    QVar12.m_data = psVar1;
    QVar12.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar12);
    QJsonValue::QJsonValue((QJsonValue *)local_50,&local_68);
    QVar13.m_data = (char *)0x5;
    QVar13.m_size = (qsizetype)this;
    auVar20 = QJsonObject::operator[](QVar13);
    local_78 = auVar20;
    QJsonValueRef::operator=((QJsonValueRef *)local_78,(QJsonValue *)local_50);
    QJsonValue::~QJsonValue((QJsonValue *)local_50);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  psVar1 = (storage_type *)(cdef->super_BaseDef).classInfoList.d.size;
  if (psVar1 != (storage_type *)0x0) {
    QVar14.m_data = psVar1;
    QVar14.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar14);
    QJsonValue::QJsonValue((QJsonValue *)local_50,&local_68);
    QVar15.m_data = (char *)0x4;
    QVar15.m_size = (qsizetype)this;
    auVar20 = QJsonObject::operator[](QVar15);
    local_78 = auVar20;
    QJsonValueRef::operator=((QJsonValueRef *)local_78,(QJsonValue *)local_50);
    QJsonValue::~QJsonValue((QJsonValue *)local_50);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QJsonValue::QJsonValue((QJsonValue *)local_50,(bool)((byte)uVar9 & 1));
  QVar16.m_data = (char *)0x6;
  QVar16.m_size = (qsizetype)this;
  local_68.d._0_16_ = QJsonObject::operator[](QVar16);
  QJsonValueRef::operator=((QJsonValueRef *)&local_68,(QJsonValue *)local_50);
  QJsonValue::~QJsonValue((QJsonValue *)local_50);
  QJsonValue::QJsonValue((QJsonValue *)local_50,SUB41((uVar9 & 2) >> 1,0));
  QVar17.m_data = (char *)0x7;
  QVar17.m_size = (qsizetype)this;
  auStack_88._8_8_ = this;
  auVar20 = QJsonObject::operator[](QVar17);
  local_68.d._0_16_ = auVar20;
  QJsonValueRef::operator=((QJsonValueRef *)&local_68,(QJsonValue *)local_50);
  QJsonValue::~QJsonValue((QJsonValue *)local_50);
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)local_78);
  pEVar2 = (cdef->super_BaseDef).enumList.d.ptr;
  if (pEVar2 != (EnumDef *)0x0) {
    pDVar3 = (cdef->super_BaseDef).enumList.d.d;
    lVar8 = 0;
    do {
      QVar18.m_data =
           *(storage_type **)
            ((long)&pDVar3[1].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i + lVar8);
      QVar18.m_size = (qsizetype)&local_68;
      QString::fromUtf8(QVar18);
      QJsonValue::QJsonValue((QJsonValue *)local_50,&local_68);
      QJsonArray::append((QJsonValue *)local_78);
      QJsonValue::~QJsonValue((QJsonValue *)local_50);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar8 = lVar8 + 0x18;
    } while ((long)pEVar2 * 0x18 != lVar8);
  }
  cVar6 = QJsonArray::isEmpty();
  uVar5 = auStack_88._8_8_;
  if (cVar6 == '\0') {
    QJsonValue::QJsonValue((QJsonValue *)local_50,(QJsonArray *)local_78);
    QVar19.m_data = (char *)0x6;
    QVar19.m_size = uVar5;
    auVar20 = QJsonObject::operator[](QVar19);
    local_68.d._0_16_ = auVar20;
    QJsonValueRef::operator=((QJsonValueRef *)&local_68,(QJsonValue *)local_50);
    QJsonValue::~QJsonValue((QJsonValue *)local_50);
  }
  QJsonArray::~QJsonArray((QJsonArray *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (EnumDef *)uVar5;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject EnumDef::toJson(const ClassDef &cdef) const
{
    QJsonObject def;
    uint flags = this->flags | cdef.enumDeclarations.value(name);
    def["name"_L1] = QString::fromUtf8(name);
    if (!enumName.isEmpty())
        def["alias"_L1] = QString::fromUtf8(enumName);
    if (!type.isEmpty())
        def["type"_L1] = QString::fromUtf8(type);
    def["isFlag"_L1] = (flags & EnumIsFlag) != 0;
    def["isClass"_L1] = (flags & EnumIsScoped) != 0;

    QJsonArray valueArr;
    for (const QByteArray &value: values)
        valueArr.append(QString::fromUtf8(value));
    if (!valueArr.isEmpty())
        def["values"_L1] = valueArr;

    return def;
}